

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * read_digit(Lexer *lexer,CharBuff *buff)

{
  bool bVar1;
  uint chr_00;
  int iVar2;
  uint chr_01;
  char *pcVar3;
  int pre_chr;
  bool dot;
  uint chr;
  CharBuff *buff_local;
  Lexer *lexer_local;
  
  bVar1 = false;
LAB_001026e7:
  do {
    chr_00 = read_chr(lexer);
    if (chr_00 == 0xc9) {
LAB_0010279a:
      pcVar3 = to_string(buff);
      return pcVar3;
    }
    iVar2 = is_digit(chr_00);
    if (iVar2 != 0) {
      append_chr(buff,(char)chr_00);
      goto LAB_001026e7;
    }
    if ((chr_00 != 0x2e) || (bVar1)) {
      unread_chr(lexer,chr_00);
      goto LAB_0010279a;
    }
    chr_01 = read_chr(lexer);
    iVar2 = is_digit(chr_01);
    if (iVar2 == 0) {
      unread_chr(lexer,chr_01);
      goto LAB_0010279a;
    }
    append_chr(buff,(char)chr_00);
    append_chr(buff,(char)chr_01);
    bVar1 = true;
  } while( true );
}

Assistant:

char *read_digit(Lexer *lexer, CharBuff* buff) {
    uint chr;
    bool dot = false;
    while ((chr = read_chr(lexer)) != END) {
        if (is_digit(chr)) {
            append_chr(buff, (char) chr);
        } else if (chr == '.' && !dot) {
            dot = true;
            int pre_chr = chr;
            chr = read_chr(lexer);
            if (is_digit(chr)) {
                append_chr(buff, (char) pre_chr);
                append_chr(buff, (char) chr);
                dot = true;
            } else {
                unread_chr(lexer, chr);
                break;
            }
        } else {
            unread_chr(lexer, chr);
            break;
        }
    }
    return to_string(buff);
}